

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::ELU_x86_fma::forward_inplace(ELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [32];
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  undefined1 (*pauVar9) [32];
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 extraout_var [60];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar10 = 0;
    auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar41 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar46 = ZEXT3264(CONCAT428(0x395e8083,
                                 CONCAT424(0x395e8083,
                                           CONCAT420(0x395e8083,
                                                     CONCAT416(0x395e8083,
                                                               CONCAT412(0x395e8083,
                                                                         CONCAT48(0x395e8083,
                                                                                  0x395e8083395e8083
                                                                                 )))))));
    auVar47 = ZEXT3264(CONCAT428(0x3ab743ce,
                                 CONCAT424(0x3ab743ce,
                                           CONCAT420(0x3ab743ce,
                                                     CONCAT416(0x3ab743ce,
                                                               CONCAT412(0x3ab743ce,
                                                                         CONCAT48(0x3ab743ce,
                                                                                  0x3ab743ce3ab743ce
                                                                                 )))))));
    auVar48 = ZEXT3264(CONCAT428(0x39506967,
                                 CONCAT424(0x39506967,
                                           CONCAT420(0x39506967,
                                                     CONCAT416(0x39506967,
                                                               CONCAT412(0x39506967,
                                                                         CONCAT48(0x39506967,
                                                                                  0x3950696739506967
                                                                                 )))))));
    auVar13 = ZEXT3264(CONCAT428(0x3c088908,
                                 CONCAT424(0x3c088908,
                                           CONCAT420(0x3c088908,
                                                     CONCAT416(0x3c088908,
                                                               CONCAT412(0x3c088908,
                                                                         CONCAT48(0x3c088908,
                                                                                  0x3c0889083c088908
                                                                                 )))))));
    auVar40 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                 CONCAT424(0x3d2aa9c1,
                                           CONCAT420(0x3d2aa9c1,
                                                     CONCAT416(0x3d2aa9c1,
                                                               CONCAT412(0x3d2aa9c1,
                                                                         CONCAT48(0x3d2aa9c1,
                                                                                  0x3d2aa9c13d2aa9c1
                                                                                 )))))));
    auVar43 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                 CONCAT424(0x3e2aaaaa,
                                           CONCAT420(0x3e2aaaaa,
                                                     CONCAT416(0x3e2aaaaa,
                                                               CONCAT412(0x3e2aaaaa,
                                                                         CONCAT48(0x3e2aaaaa,
                                                                                  0x3e2aaaaa3e2aaaaa
                                                                                 )))))));
    auVar35 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar24 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar30 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    auVar32 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
    do {
      pauVar9 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      fVar1 = (this->super_ELU).alpha;
      auVar14._4_4_ = fVar1;
      auVar14._0_4_ = fVar1;
      auVar14._8_4_ = fVar1;
      auVar14._12_4_ = fVar1;
      auVar11._16_4_ = fVar1;
      auVar11._0_16_ = auVar14;
      auVar11._20_4_ = fVar1;
      auVar11._24_4_ = fVar1;
      auVar11._28_4_ = fVar1;
      auVar34 = auVar35._0_16_;
      if ((int)uVar8 < 8) {
        uVar6 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar17 = vminps_avx(*pauVar9,auVar33._0_32_);
          auVar20._8_4_ = 0x42b0c0a5;
          auVar20._0_8_ = 0x42b0c0a542b0c0a5;
          auVar20._12_4_ = 0x42b0c0a5;
          auVar20._16_4_ = 0x42b0c0a5;
          auVar20._20_4_ = 0x42b0c0a5;
          auVar20._24_4_ = 0x42b0c0a5;
          auVar20._28_4_ = 0x42b0c0a5;
          auVar17 = vminps_avx(auVar17,auVar20);
          auVar21._8_4_ = 0xc2b0c0a5;
          auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar21._12_4_ = 0xc2b0c0a5;
          auVar21._16_4_ = 0xc2b0c0a5;
          auVar21._20_4_ = 0xc2b0c0a5;
          auVar21._24_4_ = 0xc2b0c0a5;
          auVar21._28_4_ = 0xc2b0c0a5;
          auVar3 = vmaxps_avx(auVar17,auVar21);
          auVar22._8_4_ = 0x3fb8aa3b;
          auVar22._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar22._12_4_ = 0x3fb8aa3b;
          auVar22._16_4_ = 0x3fb8aa3b;
          auVar22._20_4_ = 0x3fb8aa3b;
          auVar22._24_4_ = 0x3fb8aa3b;
          auVar22._28_4_ = 0x3fb8aa3b;
          auVar14 = vfmadd213ps_fma(auVar22,auVar3,auVar41._0_32_);
          auVar16 = vroundps_avx(ZEXT1632(auVar14),1);
          auVar17 = vcmpps_avx(ZEXT1632(auVar14),auVar16,1);
          auVar17 = vandps_avx(auVar44._0_32_,auVar17);
          auVar17 = vsubps_avx(auVar16,auVar17);
          auVar29._8_4_ = 0x3f318000;
          auVar29._0_8_ = 0x3f3180003f318000;
          auVar29._12_4_ = 0x3f318000;
          auVar29._16_4_ = 0x3f318000;
          auVar29._20_4_ = 0x3f318000;
          auVar29._24_4_ = 0x3f318000;
          auVar29._28_4_ = 0x3f318000;
          auVar14 = vfmsub231ps_fma(auVar3,auVar17,auVar29);
          auVar18 = vfmsub231ps_fma(ZEXT1632(auVar14),auVar17,auVar46._0_32_);
          auVar16 = ZEXT1632(auVar18);
          auVar3._28_4_ = 0x3f318000;
          auVar3._0_28_ =
               ZEXT1628(CONCAT412(auVar18._12_4_ * auVar18._12_4_,
                                  CONCAT48(auVar18._8_4_ * auVar18._8_4_,
                                           CONCAT44(auVar18._4_4_ * auVar18._4_4_,
                                                    auVar18._0_4_ * auVar18._0_4_))));
          auVar14 = vfmadd213ps_fma(auVar48._0_32_,auVar16,auVar47._0_32_);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar13._0_32_);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar40._0_32_);
          auVar16 = ZEXT1632(auVar18);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar43._0_32_);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar16,auVar41._0_32_);
          auVar42 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar3,auVar16);
          auVar18._0_4_ = (int)auVar17._0_4_;
          auVar18._4_4_ = (int)auVar17._4_4_;
          auVar18._8_4_ = (int)auVar17._8_4_;
          auVar18._12_4_ = (int)auVar17._12_4_;
          auVar16._16_4_ = (int)auVar17._16_4_;
          auVar16._0_16_ = auVar18;
          auVar16._20_4_ = (int)auVar17._20_4_;
          auVar16._24_4_ = (int)auVar17._24_4_;
          auVar16._28_4_ = (int)auVar17._28_4_;
          auVar18 = vpslld_avx(auVar18,0x17);
          auVar14 = vpslld_avx(auVar16._16_16_,0x17);
          auVar14 = vpaddd_avx(auVar14,auVar34);
          auVar18 = vpaddd_avx(auVar18,auVar34);
          auVar17._16_16_ = auVar14;
          auVar17._0_16_ = auVar18;
          auVar23._0_4_ = auVar44._0_4_ + auVar42._0_4_;
          auVar23._4_4_ = auVar44._4_4_ + auVar42._4_4_;
          auVar23._8_4_ = auVar44._8_4_ + auVar42._8_4_;
          auVar23._12_4_ = auVar44._12_4_ + auVar42._12_4_;
          auVar23._16_4_ = auVar44._16_4_ + 0.0;
          auVar23._20_4_ = auVar44._20_4_ + 0.0;
          auVar23._24_4_ = auVar44._24_4_ + 0.0;
          auVar23._28_4_ = auVar44._28_4_ + 0.0;
          auVar14 = vfmsub213ps_fma(auVar17,auVar23,auVar44._0_32_);
          auVar17 = vmaxps_avx(*pauVar9,auVar33._0_32_);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar11,auVar17);
          *pauVar9 = ZEXT1632(auVar14);
          pauVar9 = pauVar9 + 1;
          iVar4 = iVar4 + 8;
        } while (iVar4 < (int)uVar8);
        auVar14 = ZEXT416((uint)(this->super_ELU).alpha);
        auVar45 = ZEXT864(0) << 0x20;
        auVar24 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar30 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar32 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        uVar6 = uVar8 & 0xfffffff8;
      }
      if ((int)(uVar6 | 3) < (int)uVar8) {
        auVar14 = vshufps_avx(auVar14,auVar14,0);
        auVar42._8_4_ = 0x3f000000;
        auVar42._0_8_ = 0x3f0000003f000000;
        auVar42._12_4_ = 0x3f000000;
        uVar5 = uVar6;
        do {
          auVar18 = vminps_avx(auVar45._0_16_,*(undefined1 (*) [16])*pauVar9);
          auVar18 = vminps_avx(auVar18,auVar24._0_16_);
          auVar15 = vmaxps_avx(auVar18,auVar30._0_16_);
          auVar18 = vfmadd213ps_fma(auVar32._0_16_,auVar15,auVar42);
          auVar25._0_4_ = (int)auVar18._0_4_;
          auVar25._4_4_ = (int)auVar18._4_4_;
          auVar25._8_4_ = (int)auVar18._8_4_;
          auVar25._12_4_ = (int)auVar18._12_4_;
          auVar19 = vcvtdq2ps_avx(auVar25);
          auVar18 = vcmpps_avx(auVar18,auVar19,1);
          auVar18 = vandps_avx(auVar18,auVar34);
          auVar18 = vsubps_avx(auVar19,auVar18);
          auVar26._8_4_ = 0x3f318000;
          auVar26._0_8_ = 0x3f3180003f318000;
          auVar26._12_4_ = 0x3f318000;
          auVar19 = vfmsub231ps_fma(auVar15,auVar18,auVar26);
          auVar27._8_4_ = 0x395e8083;
          auVar27._0_8_ = 0x395e8083395e8083;
          auVar27._12_4_ = 0x395e8083;
          auVar15 = vfmsub231ps_fma(auVar19,auVar18,auVar27);
          auVar28._0_4_ = auVar15._0_4_ * auVar15._0_4_;
          auVar28._4_4_ = auVar15._4_4_ * auVar15._4_4_;
          auVar28._8_4_ = auVar15._8_4_ * auVar15._8_4_;
          auVar28._12_4_ = auVar15._12_4_ * auVar15._12_4_;
          auVar31._8_4_ = 0x39506967;
          auVar31._0_8_ = 0x3950696739506967;
          auVar31._12_4_ = 0x39506967;
          auVar36._8_4_ = 0x3ab743ce;
          auVar36._0_8_ = 0x3ab743ce3ab743ce;
          auVar36._12_4_ = 0x3ab743ce;
          auVar19 = vfmadd213ps_fma(auVar31,auVar15,auVar36);
          auVar37._8_4_ = 0x3c088908;
          auVar37._0_8_ = 0x3c0889083c088908;
          auVar37._12_4_ = 0x3c088908;
          auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar37);
          auVar38._8_4_ = 0x3d2aa9c1;
          auVar38._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar38._12_4_ = 0x3d2aa9c1;
          auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar38);
          auVar39._8_4_ = 0x3e2aaaaa;
          auVar39._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar39._12_4_ = 0x3e2aaaaa;
          auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar39);
          auVar19 = vfmadd213ps_fma(auVar19,auVar15,auVar42);
          auVar19 = vfmadd213ps_fma(auVar19,auVar28,auVar15);
          auVar30 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          auVar15._0_4_ = auVar19._0_4_ + auVar35._0_4_;
          auVar15._4_4_ = auVar19._4_4_ + auVar35._4_4_;
          auVar15._8_4_ = auVar19._8_4_ + auVar35._8_4_;
          auVar15._12_4_ = auVar19._12_4_ + auVar35._12_4_;
          auVar32 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
          auVar19._0_4_ = (int)auVar18._0_4_;
          auVar19._4_4_ = (int)auVar18._4_4_;
          auVar19._8_4_ = (int)auVar18._8_4_;
          auVar19._12_4_ = (int)auVar18._12_4_;
          auVar18 = vpslld_avx(auVar19,0x17);
          auVar18 = vpaddd_avx(auVar18,auVar34);
          auVar19 = vfmsub213ps_fma(auVar18,auVar15,auVar34);
          auVar18 = vmaxps_avx(auVar45._0_16_,*(undefined1 (*) [16])*pauVar9);
          auVar18 = vfmadd213ps_fma(auVar19,auVar14,auVar18);
          *(undefined1 (*) [16])*pauVar9 = auVar18;
          auVar24 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
          pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
          uVar6 = uVar5 + 4;
          iVar4 = uVar5 + 7;
          uVar5 = uVar6;
        } while (iVar4 < (int)uVar8);
      }
      auVar13 = ZEXT3264(CONCAT428(0x3c088908,
                                   CONCAT424(0x3c088908,
                                             CONCAT420(0x3c088908,
                                                       CONCAT416(0x3c088908,
                                                                 CONCAT412(0x3c088908,
                                                                           CONCAT48(0x3c088908,
                                                                                                                                                                        
                                                  0x3c0889083c088908)))))));
      auVar43 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                   CONCAT424(0x3e2aaaaa,
                                             CONCAT420(0x3e2aaaaa,
                                                       CONCAT416(0x3e2aaaaa,
                                                                 CONCAT412(0x3e2aaaaa,
                                                                           CONCAT48(0x3e2aaaaa,
                                                                                                                                                                        
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar40 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                   CONCAT424(0x3d2aa9c1,
                                             CONCAT420(0x3d2aa9c1,
                                                       CONCAT416(0x3d2aa9c1,
                                                                 CONCAT412(0x3d2aa9c1,
                                                                           CONCAT48(0x3d2aa9c1,
                                                                                                                                                                        
                                                  0x3d2aa9c13d2aa9c1)))))));
      if (uVar8 - uVar6 != 0 && (int)uVar6 <= (int)uVar8) {
        lVar7 = 0;
        do {
          if (*(float *)(*pauVar9 + lVar7 * 4) < 0.0) {
            fVar1 = (this->super_ELU).alpha;
            auVar12._0_4_ = expf(*(float *)(*pauVar9 + lVar7 * 4));
            auVar12._4_60_ = extraout_var;
            auVar32 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
            auVar30 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar24 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
            auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar35 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar43 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar40 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                         CONCAT424(0x3d2aa9c1,
                                                   CONCAT420(0x3d2aa9c1,
                                                             CONCAT416(0x3d2aa9c1,
                                                                       CONCAT412(0x3d2aa9c1,
                                                                                 CONCAT48(0x3d2aa9c1
                                                                                          ,
                                                  0x3d2aa9c13d2aa9c1)))))));
            auVar13 = ZEXT3264(CONCAT428(0x3c088908,
                                         CONCAT424(0x3c088908,
                                                   CONCAT420(0x3c088908,
                                                             CONCAT416(0x3c088908,
                                                                       CONCAT412(0x3c088908,
                                                                                 CONCAT48(0x3c088908
                                                                                          ,
                                                  0x3c0889083c088908)))))));
            auVar48 = ZEXT3264(CONCAT428(0x39506967,
                                         CONCAT424(0x39506967,
                                                   CONCAT420(0x39506967,
                                                             CONCAT416(0x39506967,
                                                                       CONCAT412(0x39506967,
                                                                                 CONCAT48(0x39506967
                                                                                          ,
                                                  0x3950696739506967)))))));
            auVar47 = ZEXT3264(CONCAT428(0x3ab743ce,
                                         CONCAT424(0x3ab743ce,
                                                   CONCAT420(0x3ab743ce,
                                                             CONCAT416(0x3ab743ce,
                                                                       CONCAT412(0x3ab743ce,
                                                                                 CONCAT48(0x3ab743ce
                                                                                          ,
                                                  0x3ab743ce3ab743ce)))))));
            auVar46 = ZEXT3264(CONCAT428(0x395e8083,
                                         CONCAT424(0x395e8083,
                                                   CONCAT420(0x395e8083,
                                                             CONCAT416(0x395e8083,
                                                                       CONCAT412(0x395e8083,
                                                                                 CONCAT48(0x395e8083
                                                                                          ,
                                                  0x395e8083395e8083)))))));
            auVar44 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            auVar41 = ZEXT3264(CONCAT428(0x3f000000,
                                         CONCAT424(0x3f000000,
                                                   CONCAT420(0x3f000000,
                                                             CONCAT416(0x3f000000,
                                                                       CONCAT412(0x3f000000,
                                                                                 CONCAT48(0x3f000000
                                                                                          ,
                                                  0x3f0000003f000000)))))));
            auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar14 = ZEXT416((uint)fVar1);
            auVar14 = vfmsub213ss_fma(auVar12._0_16_,auVar14,auVar14);
            *(int *)(*pauVar9 + lVar7 * 4) = auVar14._0_4_;
          }
          lVar7 = lVar7 + 1;
        } while (uVar8 - uVar6 != (int)lVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int ELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}